

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcReadVer.c
# Opt level: O1

Wlc_Ntk_t * Wlc_ReadVer(char *pFileName,char *pStr)

{
  int iVar1;
  Wlc_Prs_t *p;
  Wlc_Ntk_t *pWVar2;
  size_t sVar3;
  char *__dest;
  long lVar4;
  long lVar5;
  
  if ((pFileName == (char *)0x0) != (pStr != (char *)0x0)) {
    __assert_fail("(pFileName == NULL) != (pStr == NULL)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/wlc/wlcReadVer.c"
                  ,0x69a,"Wlc_Ntk_t *Wlc_ReadVer(char *, char *)");
  }
  p = Wlc_PrsStart(pFileName,pStr);
  if (p != (Wlc_Prs_t *)0x0) {
    iVar1 = Wlc_PrsPrepare(p);
    if (((iVar1 == 0) || (iVar1 = Wlc_PrsDerive(p), iVar1 == 0)) || (p->pNtk == (Wlc_Ntk_t *)0x0)) {
      pWVar2 = (Wlc_Ntk_t *)0x0;
    }
    else {
      pWVar2 = p->pNtk;
      if (1 < pWVar2->iObj) {
        lVar5 = 1;
        lVar4 = 0x18;
        do {
          if (pWVar2->nObjsAlloc <= lVar5) {
            __assert_fail("Id > 0 && Id < p->nObjsAlloc",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/wlc/wlc.h"
                          ,0x11a,"Wlc_Obj_t *Wlc_NtkObj(Wlc_Ntk_t *, int)");
          }
          if ((*(ushort *)(&pWVar2->pObjs->field_0x0 + lVar4) & 0x3f) == 5) {
            Vec_IntPush(&pWVar2->vFfs2,(int)lVar5);
          }
          lVar5 = lVar5 + 1;
          pWVar2 = p->pNtk;
          lVar4 = lVar4 + 0x18;
        } while (lVar5 < pWVar2->iObj);
      }
      __dest = (char *)0x0;
      pWVar2 = Wlc_NtkDupDfs(pWVar2,0,1);
      if (pFileName != (char *)0x0) {
        sVar3 = strlen(pFileName);
        __dest = (char *)malloc(sVar3 + 1);
        strcpy(__dest,pFileName);
      }
      pWVar2->pSpec = __dest;
    }
    if (p->sError[0] != '\0') {
      fputs(p->sError,_stdout);
    }
    Wlc_PrsStop(p);
    return pWVar2;
  }
  return (Wlc_Ntk_t *)0x0;
}

Assistant:

Wlc_Ntk_t * Wlc_ReadVer( char * pFileName, char * pStr )
{
    Wlc_Prs_t * p;
    Wlc_Ntk_t * pNtk = NULL;
    // either file name or string is given
    assert( (pFileName == NULL) != (pStr == NULL) );
    // start the parser 
    p = Wlc_PrsStart( pFileName, pStr );
    if ( p == NULL )
        return NULL;
    // detect lines
    if ( !Wlc_PrsPrepare( p ) )
        goto finish;
    // parse models
    if ( !Wlc_PrsDerive( p ) )
        goto finish;
    // derive topological order
    if ( p->pNtk )
    {
        Wlc_Obj_t * pObj; int i;
        Wlc_NtkForEachObj( p->pNtk, pObj, i )
            if ( pObj->Type == WLC_OBJ_FF )
                Vec_IntPush( &p->pNtk->vFfs2, Wlc_ObjId(p->pNtk, pObj) );
        pNtk = Wlc_NtkDupDfs( p->pNtk, 0, 1 );
        pNtk->pSpec = Abc_UtilStrsav( pFileName );
    }
finish:
    Wlc_PrsPrintErrorMessage( p );
    Wlc_PrsStop( p );
    return pNtk;
}